

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw-out.c
# Opt level: O3

CURLcode cw_out_do_write(cw_out_ctx *ctx,Curl_easy *data,cw_out_type otype,_Bool flush_all,char *buf
                        ,size_t blen)

{
  cw_out_buf **pcwbuf;
  CURLcode CVar1;
  undefined7 in_register_00000009;
  size_t *buf_00;
  size_t consumed;
  size_t *in_stack_ffffffffffffffb8;
  char *local_38;
  
  buf_00 = (size_t *)CONCAT71(in_register_00000009,flush_all);
  if (ctx->buf == (cw_out_buf *)0x0) {
LAB_00121c32:
    CVar1 = cw_out_ptr_flush(ctx,data,otype,SUB81(buf_00,0),buf,(size_t)&local_38,
                             in_stack_ffffffffffffffb8);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    if ((buf < local_38 || (long)buf - (long)local_38 == 0) ||
       (CVar1 = cw_out_append(ctx,otype,(char *)((long)buf_00 + (long)local_38),
                              (long)buf - (long)local_38), CVar1 == CURLE_OK)) {
      CVar1 = CURLE_OK;
    }
  }
  else {
    pcwbuf = &ctx->buf;
    if (ctx->buf->type != otype) {
      CVar1 = cw_out_flush_chain(ctx,data,pcwbuf,flush_all);
      if (CVar1 != CURLE_OK) goto LAB_00121c7f;
      in_stack_ffffffffffffffb8 = buf_00;
      if (*pcwbuf == (cw_out_buf *)0x0) goto LAB_00121c32;
    }
    CVar1 = cw_out_append(ctx,otype,(char *)buf_00,(size_t)buf);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    CVar1 = cw_out_flush_chain(ctx,data,pcwbuf,SUB81(buf,0));
  }
  if (CVar1 == CURLE_OK) {
    return CURLE_OK;
  }
LAB_00121c7f:
  ctx->field_0x28 = ctx->field_0x28 | 2;
  cw_out_bufs_free(ctx);
  return CVar1;
}

Assistant:

static CURLcode cw_out_do_write(struct cw_out_ctx *ctx,
                                struct Curl_easy *data,
                                cw_out_type otype,
                                bool flush_all,
                                const char *buf, size_t blen)
{
  CURLcode result = CURLE_OK;

  /* if we have buffered data and it is a different type than what
   * we are writing now, try to flush all */
  if(ctx->buf && ctx->buf->type != otype) {
    result = cw_out_flush_chain(ctx, data, &ctx->buf, TRUE);
    if(result)
      goto out;
  }

  if(ctx->buf) {
    /* still have buffered data, append and flush */
    result = cw_out_append(ctx, otype, buf, blen);
    if(result)
      return result;
    result = cw_out_flush_chain(ctx, data, &ctx->buf, flush_all);
    if(result)
      goto out;
  }
  else {
    /* nothing buffered, try direct write */
    size_t consumed;
    result = cw_out_ptr_flush(ctx, data, otype, flush_all,
                              buf, blen, &consumed);
    if(result)
      return result;
    if(consumed < blen) {
      /* did not write all, append the rest */
      result = cw_out_append(ctx, otype, buf + consumed, blen - consumed);
      if(result)
        goto out;
    }
  }

out:
  if(result) {
    /* We do not want to invoked client callbacks a second time after
     * encountering an error. See issue #13337 */
    ctx->errored = TRUE;
    cw_out_bufs_free(ctx);
  }
  return result;
}